

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wm_abstract.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
rw::operator<<(basic_ostream<char,_std::char_traits<char>_> *stream,
              vector<rw::Window_*,_std::allocator<rw::Window_*>_> *v)

{
  basic_ostream<char,_std::char_traits<char>_> *stream_00;
  pointer ppWVar1;
  
  std::operator<<(stream,"[");
  ppWVar1 = (v->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  stream_00 = stream;
  if (ppWVar1 ==
      (v->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_00110699;
  while( true ) {
    operator<<(stream_00,*ppWVar1);
    ppWVar1 = ppWVar1 + 1;
LAB_00110699:
    if (ppWVar1 ==
        (v->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) break;
    stream_00 = std::operator<<(stream,",\n ");
  }
  std::operator<<(stream,"]");
  return stream;
}

Assistant:

T &operator<<(T &stream, const vector<Window *> v) {
        stream << "[";
        auto i = v.begin();
        if (i != v.end()) {
            stream << *i;
            i++;
        }
        while (i != v.end()) {
            stream << ",\n " << *i;
            i++;
        }
        stream << "]";
        return stream;
    }